

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.cpp
# Opt level: O0

bool __thiscall wasm::PassRunner::shouldPreserveDWARF(PassRunner *this)

{
  bool bVar1;
  PassRunner *this_local;
  
  bVar1 = Debug::shouldPreserveDWARF(&this->options,this->wasm);
  if (bVar1) {
    if ((this->addedPassesRemovedDWARF & 1U) == 0) {
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool PassRunner::shouldPreserveDWARF() {
  // Check if the debugging subsystem wants to preserve DWARF.
  if (!Debug::shouldPreserveDWARF(options, *wasm)) {
    return false;
  }

  // We may need DWARF. Check if one of our previous passes would remove it
  // anyhow, in which case, there is nothing to preserve.
  if (addedPassesRemovedDWARF) {
    return false;
  }

  return true;
}